

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void greatest_run_suite(greatest_suite_cb *suite_cb,char *suite_name)

{
  int iVar1;
  char *pcVar2;
  
  if ((greatest_info.suite_filter != (char *)0x0) &&
     (iVar1 = greatest_name_match(suite_name,greatest_info.suite_filter), iVar1 == 0)) {
    return;
  }
  greatest_info.teardown = (undefined1 *)0x0;
  greatest_info.teardown_udata = (void *)0x0;
  greatest_info.setup = (undefined1 *)0x0;
  greatest_info.setup_udata = (void *)0x0;
  greatest_info.passed = greatest_info.passed + greatest_info.suite.passed;
  greatest_info.failed = greatest_info.failed + greatest_info.suite.failed;
  greatest_info.skipped = greatest_info.skipped + greatest_info.suite.skipped;
  greatest_info.tests_run = greatest_info.tests_run + greatest_info.suite.tests_run;
  greatest_info.suite.pre_suite = 0;
  greatest_info.suite.post_suite = 0;
  greatest_info.suite.pre_test = 0;
  greatest_info.suite.post_test = 0;
  greatest_info.suite.tests_run = 0;
  greatest_info.suite.passed = 0;
  greatest_info.suite.failed = 0;
  greatest_info.suite.skipped = 0;
  greatest_info.col = 0;
  if ((greatest_info.flags & greatest_info.failed != 0) != 0) {
    greatest_info.col = 0;
    greatest_info.teardown_udata = (void *)0x0;
    greatest_info.teardown = (undefined1 *)0x0;
    greatest_info.setup_udata = (void *)0x0;
    greatest_info.setup = (undefined1 *)0x0;
    greatest_info.suite.post_test = 0;
    greatest_info.suite.pre_test = 0;
    greatest_info.suite.post_suite = 0;
    greatest_info.suite.pre_suite = 0;
    greatest_info.suite.failed = 0;
    greatest_info.suite.skipped = 0;
    greatest_info.suite.tests_run = 0;
    greatest_info.suite.passed = 0;
    return;
  }
  fprintf(_stdout,"\n* Suite %s:\n",suite_name);
  greatest_info.suite.pre_suite = clock();
  if (greatest_info.suite.pre_suite == -1) {
    pcVar2 = "greatest_info.suite.pre_suite";
  }
  else {
    (*suite_cb)();
    greatest_info.suite.post_suite = clock();
    if (greatest_info.suite.post_suite != -1) {
      if (greatest_info.suite.tests_run == 0) {
        return;
      }
      pcVar2 = "s";
      if (greatest_info.suite.tests_run == 1) {
        pcVar2 = "";
      }
      fprintf(_stdout,"\n%u test%s - %u passed, %u failed, %u skipped",
              greatest_info.suite._0_8_ & 0xffffffff,pcVar2,(ulong)greatest_info.suite._0_8_ >> 0x20
              ,greatest_info.suite._8_8_ & 0xffffffff,greatest_info.suite.skipped);
      fprintf(_stdout," (%lu ticks, %.3f sec)",
              SUB84((double)(greatest_info.suite.post_suite - greatest_info.suite.pre_suite) /
                    1000000.0,0));
      fputc(10,_stdout);
      return;
    }
    pcVar2 = "greatest_info.suite.post_suite";
    greatest_info.suite.post_suite = -1;
  }
  fprintf(_stdout,"clock error: %s\n",pcVar2);
  exit(1);
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}